

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::TensorType::InternalSwap(TensorType *this,TensorType *other)

{
  int iVar1;
  int64 iVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->dimensions_).super_RepeatedPtrFieldBase,
             &(other->dimensions_).super_RepeatedPtrFieldBase);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::swap(&(this->attributes_).map_,&(other->attributes_).map_);
  iVar2 = this->rank_;
  this->rank_ = other->rank_;
  other->rank_ = iVar2;
  iVar1 = this->datatype_;
  this->datatype_ = other->datatype_;
  other->datatype_ = iVar1;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void TensorType::InternalSwap(TensorType* other) {
  dimensions_.InternalSwap(&other->dimensions_);
  attributes_.Swap(&other->attributes_);
  std::swap(rank_, other->rank_);
  std::swap(datatype_, other->datatype_);
  std::swap(_cached_size_, other->_cached_size_);
}